

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemAloha.cpp
# Opt level: O2

double __thiscall ProblemAloha::backlogToReward(ProblemAloha *this,Index backlog)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 in_ZMM0 [64];
  
  uVar1 = *(uint *)&(this->super_FactoredDecPOMDPDiscrete).field_0x708;
  if (uVar1 < 3) {
    auVar3 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,backlog);
    auVar2._8_8_ = 0x8000000000000000;
    auVar2._0_8_ = 0x8000000000000000;
    auVar3 = vorpd_avx512vl(auVar3,auVar2);
    return auVar3._0_8_;
  }
  if (uVar1 == 3) {
    auVar3 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,backlog);
    dVar4 = exp2(auVar3._0_8_);
    return 1.0 - dVar4;
  }
  return 42.0;
}

Assistant:

double ProblemAloha::backlogToReward(Index backlog) const
{
    double reward=42;
    switch(_m_variation)
    {
    case NewPacket:
    case NewPacketSendAll:
    case NoNewPacket:
        reward=-static_cast<double>(backlog);
        break;
    case NewPacketProgressivePenalty:
        reward=1-pow(2,static_cast<double>(backlog));
        break;
    }
    return(reward);
}